

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O2

void __thiscall TxOrphanage::EraseForBlock(TxOrphanage *this,CBlock *block)

{
  long lVar1;
  pointer psVar2;
  element_type *peVar3;
  CBlock *pCVar4;
  int iVar5;
  pointer ptVar6;
  bool bVar7;
  int iVar8;
  iterator iVar9;
  TxOrphanage *pTVar10;
  CTransactionRef *ptx;
  pointer psVar11;
  TxOrphanage *category;
  CTxIn *txin;
  CBlock *pCVar12;
  iterator __begin2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int nErased;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> vOrphanErase;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  vOrphanErase.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vOrphanErase.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vOrphanErase.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  category = this;
  for (psVar11 = (block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ptVar6 = vOrphanErase.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, psVar11 != psVar2; psVar11 = psVar11 + 1)
  {
    peVar3 = (psVar11->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar4 = (CBlock *)
             (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar12 = (CBlock *)
                   (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start; pCVar12 != pCVar4;
        pCVar12 = (CBlock *)&pCVar12->fChecked) {
      block = pCVar12;
      category = (TxOrphanage *)&this->m_outpoint_to_orphan_it;
      iVar9 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
              ::find(&(this->m_outpoint_to_orphan_it)._M_t,(key_type *)pCVar12);
      if ((_Rb_tree_header *)iVar9._M_node !=
          &(this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header) {
        for (pTVar10 = *(TxOrphanage **)(iVar9._M_node + 3);
            pTVar10 != (TxOrphanage *)&iVar9._M_node[2]._M_left;
            pTVar10 = (TxOrphanage *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar10)) {
          block = (CBlock *)
                  (*(long *)((pTVar10->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_right + 2) + 0x59);
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::push_back(&vOrphanErase,(value_type *)block);
          category = pTVar10;
        }
      }
    }
  }
  if (vOrphanErase.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      vOrphanErase.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    nErased = 0;
    for (pCVar12 = (CBlock *)
                   vOrphanErase.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; iVar5 = nErased,
        pCVar12 != (CBlock *)ptVar6;
        pCVar12 = (CBlock *)
                  ((pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  + 0x1c)) {
      block = pCVar12;
      category = this;
      iVar8 = EraseTx(this,(Wtxid *)pCVar12);
      nErased = iVar5 + iVar8;
    }
    bVar7 = ::LogAcceptCategory((LogFlags)category,(Level)block);
    if (bVar7) {
      logging_function._M_str = "EraseForBlock";
      logging_function._M_len = 0xd;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<int>
                (logging_function,source_file,0xcf,TXPACKAGES,Debug,
                 (ConstevalFormatString<1U>)0x6c296c,&nErased);
    }
  }
  std::_Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
  ~_Vector_base(&vOrphanErase.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxOrphanage::EraseForBlock(const CBlock& block)
{
    std::vector<Wtxid> vOrphanErase;

    for (const CTransactionRef& ptx : block.vtx) {
        const CTransaction& tx = *ptx;

        // Which orphan pool entries must we evict?
        for (const auto& txin : tx.vin) {
            auto itByPrev = m_outpoint_to_orphan_it.find(txin.prevout);
            if (itByPrev == m_outpoint_to_orphan_it.end()) continue;
            for (auto mi = itByPrev->second.begin(); mi != itByPrev->second.end(); ++mi) {
                const CTransaction& orphanTx = *(*mi)->second.tx;
                vOrphanErase.push_back(orphanTx.GetWitnessHash());
            }
        }
    }

    // Erase orphan transactions included or precluded by this block
    if (vOrphanErase.size()) {
        int nErased = 0;
        for (const auto& orphanHash : vOrphanErase) {
            nErased += EraseTx(orphanHash);
        }
        LogDebug(BCLog::TXPACKAGES, "Erased %d orphan transaction(s) included or conflicted by block\n", nErased);
    }
}